

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuidedMeshNormalFiltering.cpp
# Opt level: O2

void __thiscall GuidedMeshNormalFiltering::initParameters(GuidedMeshNormalFiltering *this)

{
  ParameterSet *pPVar1;
  string local_40;
  allocator local_19;
  
  ParameterSet::removeAllParameter((this->super_MeshDenoisingBase).parameter_set_);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::__cxx11::string::string((string *)&local_40,"Denoise Type",&local_19);
  ParameterSet::addParameter(pPVar1,&local_40,0);
  std::__cxx11::string::~string((string *)&local_40);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::__cxx11::string::string((string *)&local_40,"Face Neighbor",&local_19);
  ParameterSet::addParameter(pPVar1,&local_40,0);
  std::__cxx11::string::~string((string *)&local_40);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::__cxx11::string::string((string *)&local_40,"include central face",&local_19);
  ParameterSet::addParameter(pPVar1,&local_40,true);
  std::__cxx11::string::~string((string *)&local_40);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::__cxx11::string::string((string *)&local_40,"Multiple(* avg face dis.)",&local_19);
  ParameterSet::addParameter(pPVar1,&local_40,2.0);
  std::__cxx11::string::~string((string *)&local_40);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::__cxx11::string::string((string *)&local_40,"Multiple(* sigma_s)",&local_19);
  ParameterSet::addParameter(pPVar1,&local_40,1.0);
  std::__cxx11::string::~string((string *)&local_40);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::__cxx11::string::string((string *)&local_40,"sigma_r",&local_19);
  ParameterSet::addParameter(pPVar1,&local_40,0.35);
  std::__cxx11::string::~string((string *)&local_40);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::__cxx11::string::string((string *)&local_40,"(Local)Normal Iteration Num.",&local_19);
  ParameterSet::addParameter(pPVar1,&local_40,0x14);
  std::__cxx11::string::~string((string *)&local_40);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::__cxx11::string::string((string *)&local_40,"(Global)Normal Iteration Num.",&local_19);
  ParameterSet::addParameter(pPVar1,&local_40,1);
  std::__cxx11::string::~string((string *)&local_40);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::__cxx11::string::string((string *)&local_40,"smoothness",&local_19);
  ParameterSet::addParameter(pPVar1,&local_40,0.01);
  std::__cxx11::string::~string((string *)&local_40);
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  std::__cxx11::string::string((string *)&local_40,"Vertex Iteration Num.",&local_19);
  ParameterSet::addParameter(pPVar1,&local_40,10);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void GuidedMeshNormalFiltering::initParameters()
{
    parameter_set_->removeAllParameter();

    parameter_set_->addParameter(string("Denoise Type"), 0);


    parameter_set_->addParameter(string("Face Neighbor"), 0);
    parameter_set_->addParameter(string("include central face"), true);

    parameter_set_->addParameter(string("Multiple(* avg face dis.)"), 2.0);
    parameter_set_->addParameter(string("Multiple(* sigma_s)"), 1.0);

    parameter_set_->addParameter(string("sigma_r"), 0.35);

    parameter_set_->addParameter(string("(Local)Normal Iteration Num."), 20);
    parameter_set_->addParameter(string("(Global)Normal Iteration Num."), 1);

    parameter_set_->addParameter(string("smoothness"), 0.01);

    parameter_set_->addParameter(string("Vertex Iteration Num."), 10);
}